

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O0

lys_module * ly_ctx_get_disabled_module_iter(ly_ctx *ctx,uint32_t *idx)

{
  uint uVar1;
  lys_module **pplVar2;
  uint32_t *idx_local;
  ly_ctx *ctx_local;
  
  if ((ctx == (ly_ctx *)0x0) || (idx == (uint32_t *)0x0)) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid arguments (%s()).",
           "ly_ctx_get_disabled_module_iter");
  }
  else {
    while (*idx < (uint)(ctx->models).used) {
      if ((*(ushort *)&(ctx->models).list[*idx]->field_0x40 >> 6 & 1) != 0) {
        pplVar2 = (ctx->models).list;
        uVar1 = *idx;
        *idx = uVar1 + 1;
        return pplVar2[uVar1];
      }
      *idx = *idx + 1;
    }
  }
  return (lys_module *)0x0;
}

Assistant:

lys_module *
ly_ctx_get_disabled_module_iter(const struct ly_ctx *ctx, uint32_t *idx)
{
    if (!ctx || !idx) {
        LOGARG;
        return NULL;
    }

    for ( ; *idx < (unsigned)ctx->models.used; (*idx)++) {
        if (ctx->models.list[(*idx)]->disabled) {
            return ctx->models.list[(*idx)++];
        }
    }

    return NULL;
}